

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_internal.h
# Opt level: O2

mbedtls_x509_crt * mbedtls_ssl_own_cert(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_key_cert *pmVar1;
  
  if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
      (pmVar1 = ssl->handshake->key_cert, pmVar1 == (mbedtls_ssl_key_cert *)0x0)) &&
     (pmVar1 = ssl->conf->key_cert, pmVar1 == (mbedtls_ssl_key_cert *)0x0)) {
    return (mbedtls_x509_crt *)0x0;
  }
  return pmVar1->cert;
}

Assistant:

static inline mbedtls_x509_crt *mbedtls_ssl_own_cert( mbedtls_ssl_context *ssl )
{
    mbedtls_ssl_key_cert *key_cert;

    if( ssl->handshake != NULL && ssl->handshake->key_cert != NULL )
        key_cert = ssl->handshake->key_cert;
    else
        key_cert = ssl->conf->key_cert;

    return( key_cert == NULL ? NULL : key_cert->cert );
}